

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.cc
# Opt level: O2

int __thiscall Array::subsequence(Array *this,Array_S *ar)

{
  uint uVar1;
  int iVar2;
  reference pvVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  size_type __n;
  size_type __n_00;
  int local_6c;
  Array_S ar2;
  Array_S ar1;
  __shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  ar1.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ar1.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ar2.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ar2.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar6 = this->theSize;
  uVar1 = ((ar->super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->theSize;
  if ((int)uVar1 < (int)uVar6) {
    std::__shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&ar1.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>,
               &ar->super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<Array,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Array,void>
              ((__shared_ptr<Array,(__gnu_cxx::_Lock_policy)2> *)&local_40,this);
    std::__shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&ar2.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    local_6c = -1;
    uVar4 = uVar6;
    uVar6 = uVar1;
  }
  else {
    std::__shared_ptr<Array,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Array,void>
              ((__shared_ptr<Array,(__gnu_cxx::_Lock_policy)2> *)&local_40,this);
    std::__shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&ar1.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::__shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&ar2.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>,
               &ar->super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>);
    local_6c = 1;
    uVar4 = uVar1;
  }
  __n = 0;
  uVar7 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar7 = __n;
  }
  iVar5 = 0;
  do {
    if (__n == uVar7) goto LAB_0010ddda;
    for (__n_00 = (size_type)iVar5; (long)__n_00 < (long)(int)uVar4; __n_00 = __n_00 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::at
                         (((ar1.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          theArray).
                          super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,__n);
      iVar2 = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::at
                         (((ar2.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          theArray).
                          super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,__n_00);
      if (iVar2 == *pvVar3) {
        iVar5 = (int)__n_00 + 1;
        break;
      }
    }
    __n = __n + 1;
  } while ((int)__n_00 < (ar2.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->theSize
          );
  local_6c = 0;
LAB_0010ddda:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ar2.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ar1.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return local_6c;
}

Assistant:

int Array::subsequence(Array_S ar) {
    int i, j;
    int sz1, sz2;
    Array_S ar1, ar2;
    int retval;

    if (theSize <= ar->theSize) {
        sz1 = theSize;
        sz2 = ar->theSize;
        ar1 = shared_ptr<Array>(this);
        ar2 = ar;
        retval = 1;
    } else {
        sz1 = ar->theSize;
        sz2 = theSize;
        ar1 = ar;
        ar2 = shared_ptr<Array>(this);
        retval = -1;
    }
    int start = 0;
    for (i = 0; i < sz1; i++) {
        for (j = start; j < sz2; j++) {
            if (ar1->theArray->at(i) == ar2->theArray->at(j)) {
                start = j + 1;
                break;
            }
        }
        if (j >= ar2->theSize) return 0;
    }
    return retval;
}